

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O1

double __thiscall
trento::DeformedWoodsSaxonNucleus::deformed_woods_saxon_dist
          (DeformedWoodsSaxonNucleus *this,double r,double cos_theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar3 = cos_theta * cos_theta;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar3;
  auVar2 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar4,ZEXT816(0x4008000000000000));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar3 * 35.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar3 * -30.0;
  auVar4 = vfmadd231sd_fma(auVar8,auVar4,auVar7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->beta2_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar2._0_8_ * 0.31539156525252;
  auVar1 = vfmadd132sd_fma(auVar6,ZEXT816(0x3ff0000000000000),auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->beta4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (auVar4._0_8_ + 3.0) * 0.10578554691520431;
  auVar1 = vfmadd231sd_fma(auVar1,auVar5,auVar2);
  dVar3 = exp((r - auVar1._0_8_ * this->R_) / this->a_);
  return 1.0 / (dVar3 + 1.0);
}

Assistant:

double DeformedWoodsSaxonNucleus::deformed_woods_saxon_dist(
    double r, double cos_theta) const {
  auto cos_theta_sq = cos_theta*cos_theta;

  // spherical harmonics
  using math::double_constants::one_div_root_pi;
  auto Y20 = std::sqrt(5)/4. * one_div_root_pi * (3.*cos_theta_sq - 1.);
  auto Y40 = 3./16. * one_div_root_pi *
             (35.*cos_theta_sq*cos_theta_sq - 30.*cos_theta_sq + 3.);

  // "effective" radius
  auto Reff = R_ * (1. + beta2_*Y20 + beta4_*Y40);

  return 1. / (1. + std::exp((r - Reff) / a_));
}